

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration.h
# Opt level: O2

void __thiscall
wasm::AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
          (AbstractChildIterator<wasm::ChildIterator> *this,Expression *parent)

{
  Block *pBVar1;
  StringMeasure *pSVar2;
  ArrayCopy *pAVar3;
  StringAs *pSVar4;
  ArrayInit *pAVar5;
  MemoryFill *pMVar6;
  BrOn *pBVar7;
  RefIsNull *pRVar8;
  ArraySet *pAVar9;
  MemoryCopy *pMVar10;
  SIMDReplace *pSVar11;
  TableGet *pTVar12;
  StructGet *pSVar13;
  SIMDShuffle *pSVar14;
  I31Get *pIVar15;
  AtomicNotify *pAVar16;
  MemoryGrow *pMVar17;
  TableGrow *pTVar18;
  Return *pRVar19;
  StringSliceIter *pSVar20;
  StringSliceWTF *pSVar21;
  StringWTF8Advance *pSVar22;
  RefCast *pRVar23;
  AtomicWait *pAVar24;
  TupleExtract *pTVar25;
  StringEq *pSVar26;
  TupleMake *pTVar27;
  Binary *pBVar28;
  StructSet *pSVar29;
  RefAs *pRVar30;
  Load *pLVar31;
  CallRef *pCVar32;
  ArrayFill *pAVar33;
  GlobalSet *pGVar34;
  SIMDTernary *pSVar35;
  ArrayLen *pAVar36;
  Call *pCVar37;
  StructNew *pSVar38;
  ArrayNew *pAVar39;
  ArrayNewFixed *pAVar40;
  Expression **ppEVar41;
  ArrayNewSeg *pAVar42;
  LocalSet *pLVar43;
  Break *pBVar44;
  Unary *pUVar45;
  Switch *pSVar46;
  Loop *pLVar47;
  If *pIVar48;
  Select *pSVar49;
  CallIndirect *pCVar50;
  Store *pSVar51;
  AtomicRMW *pAVar52;
  StringEncode *pSVar53;
  ArrayGet *pAVar54;
  Drop *pDVar55;
  SIMDLoad *pSVar56;
  AtomicCmpxchg *pAVar57;
  TableSet *pTVar58;
  Try *pTVar59;
  SIMDShift *pSVar60;
  SIMDLoadStoreLane *pSVar61;
  SIMDExtract *pSVar62;
  StringWTF16Get *pSVar63;
  MemoryInit *pMVar64;
  Throw *pTVar65;
  I31New *pIVar66;
  RefEq *pRVar67;
  StringConcat *pSVar68;
  RefTest *pRVar69;
  StringIterNext *pSVar70;
  StringIterMove *pSVar71;
  StringNew *pSVar72;
  ulong uVar73;
  
  (this->children).usedFixed = 0;
  (this->children).flexible.
  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->children).flexible.
  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).flexible.
  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(parent->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
               ,0xb0);
  case BlockId:
    pBVar1 = Expression::cast<wasm::Block>(parent);
    uVar73 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar73) {
      uVar73 = uVar73 - 1;
      ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar73);
      addChild(this,parent,ppEVar41);
    }
    break;
  case IfId:
    pIVar48 = Expression::cast<wasm::If>(parent);
    if (*(long *)(pIVar48 + 0x20) != 0) {
      addChild(this,parent,(Expression **)(pIVar48 + 0x20));
    }
    addChild(this,parent,(Expression **)(pIVar48 + 0x18));
    addChild(this,parent,(Expression **)(pIVar48 + 0x10));
    break;
  case LoopId:
    pLVar47 = Expression::cast<wasm::Loop>(parent);
    addChild(this,parent,(Expression **)(pLVar47 + 0x20));
    break;
  case BreakId:
    pBVar44 = Expression::cast<wasm::Break>(parent);
    if (*(long *)(pBVar44 + 0x28) != 0) {
      addChild(this,parent,(Expression **)(pBVar44 + 0x28));
    }
    if (*(long *)(pBVar44 + 0x20) != 0) {
      addChild(this,parent,(Expression **)(pBVar44 + 0x20));
    }
    break;
  case SwitchId:
    pSVar46 = Expression::cast<wasm::Switch>(parent);
    addChild(this,parent,(Expression **)(pSVar46 + 0x48));
    if (*(long *)(pSVar46 + 0x40) != 0) {
      addChild(this,parent,(Expression **)(pSVar46 + 0x40));
    }
    break;
  case CallId:
    pCVar37 = Expression::cast<wasm::Call>(parent);
    uVar73 = (ulong)*(uint *)(pCVar37 + 0x18);
    while (0 < (int)uVar73) {
      uVar73 = uVar73 - 1;
      ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar37 + 0x10),uVar73);
      addChild(this,parent,ppEVar41);
    }
    break;
  case CallIndirectId:
    pCVar50 = Expression::cast<wasm::CallIndirect>(parent);
    addChild(this,parent,(Expression **)(pCVar50 + 0x38));
    uVar73 = (ulong)*(uint *)(pCVar50 + 0x20);
    while (0 < (int)uVar73) {
      uVar73 = uVar73 - 1;
      ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar50 + 0x18),uVar73);
      addChild(this,parent,ppEVar41);
    }
    break;
  case LocalGetId:
    Expression::cast<wasm::LocalGet>(parent);
    return;
  case LocalSetId:
    pLVar43 = Expression::cast<wasm::LocalSet>(parent);
    addChild(this,parent,(Expression **)(pLVar43 + 0x18));
    break;
  case GlobalGetId:
    Expression::cast<wasm::GlobalGet>(parent);
    return;
  case GlobalSetId:
    pGVar34 = Expression::cast<wasm::GlobalSet>(parent);
    addChild(this,parent,(Expression **)(pGVar34 + 0x20));
    break;
  case LoadId:
    pLVar31 = Expression::cast<wasm::Load>(parent);
    addChild(this,parent,(Expression **)(pLVar31 + 0x30));
    break;
  case StoreId:
    pSVar51 = Expression::cast<wasm::Store>(parent);
    addChild(this,parent,(Expression **)(pSVar51 + 0x38));
    addChild(this,parent,(Expression **)(pSVar51 + 0x30));
    break;
  case ConstId:
    Expression::cast<wasm::Const>(parent);
    return;
  case UnaryId:
    pUVar45 = Expression::cast<wasm::Unary>(parent);
    addChild(this,parent,&pUVar45->value);
    break;
  case BinaryId:
    pBVar28 = Expression::cast<wasm::Binary>(parent);
    addChild(this,parent,(Expression **)(pBVar28 + 0x20));
    addChild(this,parent,(Expression **)(pBVar28 + 0x18));
    break;
  case SelectId:
    pSVar49 = Expression::cast<wasm::Select>(parent);
    addChild(this,parent,(Expression **)(pSVar49 + 0x20));
    addChild(this,parent,(Expression **)(pSVar49 + 0x18));
    addChild(this,parent,(Expression **)(pSVar49 + 0x10));
    break;
  case DropId:
    pDVar55 = Expression::cast<wasm::Drop>(parent);
    addChild(this,parent,&pDVar55->value);
    break;
  case ReturnId:
    pRVar19 = Expression::cast<wasm::Return>(parent);
    if (*(long *)(pRVar19 + 0x10) != 0) {
      addChild(this,parent,(Expression **)(pRVar19 + 0x10));
    }
    break;
  case MemorySizeId:
    Expression::cast<wasm::MemorySize>(parent);
    return;
  case MemoryGrowId:
    pMVar17 = Expression::cast<wasm::MemoryGrow>(parent);
    addChild(this,parent,(Expression **)(pMVar17 + 0x10));
    break;
  case NopId:
    Expression::cast<wasm::Nop>(parent);
    return;
  case UnreachableId:
    Expression::cast<wasm::Unreachable>(parent);
    return;
  case AtomicRMWId:
    pAVar52 = Expression::cast<wasm::AtomicRMW>(parent);
    addChild(this,parent,(Expression **)(pAVar52 + 0x28));
    addChild(this,parent,(Expression **)(pAVar52 + 0x20));
    break;
  case AtomicCmpxchgId:
    pAVar57 = Expression::cast<wasm::AtomicCmpxchg>(parent);
    addChild(this,parent,(Expression **)(pAVar57 + 0x30));
    addChild(this,parent,(Expression **)(pAVar57 + 0x28));
    addChild(this,parent,(Expression **)(pAVar57 + 0x20));
    break;
  case AtomicWaitId:
    pAVar24 = Expression::cast<wasm::AtomicWait>(parent);
    addChild(this,parent,(Expression **)(pAVar24 + 0x28));
    addChild(this,parent,(Expression **)(pAVar24 + 0x20));
    addChild(this,parent,(Expression **)(pAVar24 + 0x18));
    break;
  case AtomicNotifyId:
    pAVar16 = Expression::cast<wasm::AtomicNotify>(parent);
    addChild(this,parent,(Expression **)(pAVar16 + 0x20));
    addChild(this,parent,(Expression **)(pAVar16 + 0x18));
    break;
  case AtomicFenceId:
    Expression::cast<wasm::AtomicFence>(parent);
    return;
  case SIMDExtractId:
    pSVar62 = Expression::cast<wasm::SIMDExtract>(parent);
    addChild(this,parent,(Expression **)(pSVar62 + 0x18));
    break;
  case SIMDReplaceId:
    pSVar11 = Expression::cast<wasm::SIMDReplace>(parent);
    addChild(this,parent,(Expression **)(pSVar11 + 0x28));
    addChild(this,parent,(Expression **)(pSVar11 + 0x18));
    break;
  case SIMDShuffleId:
    pSVar14 = Expression::cast<wasm::SIMDShuffle>(parent);
    addChild(this,parent,(Expression **)(pSVar14 + 0x18));
    addChild(this,parent,(Expression **)(pSVar14 + 0x10));
    break;
  case SIMDTernaryId:
    pSVar35 = Expression::cast<wasm::SIMDTernary>(parent);
    addChild(this,parent,(Expression **)(pSVar35 + 0x28));
    addChild(this,parent,(Expression **)(pSVar35 + 0x20));
    addChild(this,parent,(Expression **)(pSVar35 + 0x18));
    break;
  case SIMDShiftId:
    pSVar60 = Expression::cast<wasm::SIMDShift>(parent);
    addChild(this,parent,(Expression **)(pSVar60 + 0x20));
    addChild(this,parent,(Expression **)(pSVar60 + 0x18));
    break;
  case SIMDLoadId:
    pSVar56 = Expression::cast<wasm::SIMDLoad>(parent);
    addChild(this,parent,(Expression **)(pSVar56 + 0x28));
    break;
  case SIMDLoadStoreLaneId:
    pSVar61 = Expression::cast<wasm::SIMDLoadStoreLane>(parent);
    addChild(this,parent,(Expression **)(pSVar61 + 0x38));
    addChild(this,parent,(Expression **)(pSVar61 + 0x30));
    break;
  case MemoryInitId:
    pMVar64 = Expression::cast<wasm::MemoryInit>(parent);
    addChild(this,parent,(Expression **)(pMVar64 + 0x30));
    addChild(this,parent,(Expression **)(pMVar64 + 0x28));
    addChild(this,parent,(Expression **)(pMVar64 + 0x20));
    break;
  case DataDropId:
    Expression::cast<wasm::DataDrop>(parent);
    return;
  case MemoryCopyId:
    pMVar10 = Expression::cast<wasm::MemoryCopy>(parent);
    addChild(this,parent,(Expression **)(pMVar10 + 0x20));
    addChild(this,parent,(Expression **)(pMVar10 + 0x18));
    addChild(this,parent,(Expression **)(pMVar10 + 0x10));
    break;
  case MemoryFillId:
    pMVar6 = Expression::cast<wasm::MemoryFill>(parent);
    addChild(this,parent,(Expression **)(pMVar6 + 0x20));
    addChild(this,parent,(Expression **)(pMVar6 + 0x18));
    addChild(this,parent,(Expression **)(pMVar6 + 0x10));
    break;
  case PopId:
    Expression::cast<wasm::Pop>(parent);
    return;
  case RefNullId:
    Expression::cast<wasm::RefNull>(parent);
    return;
  case RefIsNullId:
    pRVar8 = Expression::cast<wasm::RefIsNull>(parent);
    addChild(this,parent,(Expression **)(pRVar8 + 0x10));
    break;
  case RefFuncId:
    Expression::cast<wasm::RefFunc>(parent);
    return;
  case RefEqId:
    pRVar67 = Expression::cast<wasm::RefEq>(parent);
    addChild(this,parent,(Expression **)(pRVar67 + 0x18));
    addChild(this,parent,(Expression **)(pRVar67 + 0x10));
    break;
  case TableGetId:
    pTVar12 = Expression::cast<wasm::TableGet>(parent);
    addChild(this,parent,(Expression **)(pTVar12 + 0x20));
    break;
  case TableSetId:
    pTVar58 = Expression::cast<wasm::TableSet>(parent);
    addChild(this,parent,(Expression **)(pTVar58 + 0x28));
    addChild(this,parent,(Expression **)(pTVar58 + 0x20));
    break;
  case TableSizeId:
    Expression::cast<wasm::TableSize>(parent);
    return;
  case TableGrowId:
    pTVar18 = Expression::cast<wasm::TableGrow>(parent);
    addChild(this,parent,(Expression **)(pTVar18 + 0x28));
    addChild(this,parent,(Expression **)(pTVar18 + 0x20));
    break;
  case TryId:
    pTVar59 = Expression::cast<wasm::Try>(parent);
    uVar73 = (ulong)*(uint *)(pTVar59 + 0x50);
    while (0 < (int)uVar73) {
      uVar73 = uVar73 - 1;
      ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar59 + 0x48),uVar73);
      addChild(this,parent,ppEVar41);
    }
    addChild(this,parent,(Expression **)(pTVar59 + 0x20));
    break;
  case ThrowId:
    pTVar65 = Expression::cast<wasm::Throw>(parent);
    uVar73 = (ulong)*(uint *)(pTVar65 + 0x28);
    while (0 < (int)uVar73) {
      uVar73 = uVar73 - 1;
      ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar65 + 0x20),uVar73);
      addChild(this,parent,ppEVar41);
    }
    break;
  case RethrowId:
    Expression::cast<wasm::Rethrow>(parent);
    return;
  case TupleMakeId:
    pTVar27 = Expression::cast<wasm::TupleMake>(parent);
    uVar73 = (ulong)(uint)(pTVar27->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar73) {
      uVar73 = uVar73 - 1;
      ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar27->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar73);
      addChild(this,parent,ppEVar41);
    }
    break;
  case TupleExtractId:
    pTVar25 = Expression::cast<wasm::TupleExtract>(parent);
    addChild(this,parent,(Expression **)(pTVar25 + 0x10));
    break;
  case I31NewId:
    pIVar66 = Expression::cast<wasm::I31New>(parent);
    addChild(this,parent,&pIVar66->value);
    break;
  case I31GetId:
    pIVar15 = Expression::cast<wasm::I31Get>(parent);
    addChild(this,parent,(Expression **)(pIVar15 + 0x10));
    break;
  case CallRefId:
    pCVar32 = Expression::cast<wasm::CallRef>(parent);
    addChild(this,parent,(Expression **)(pCVar32 + 0x30));
    uVar73 = (ulong)*(uint *)(pCVar32 + 0x18);
    while (0 < (int)uVar73) {
      uVar73 = uVar73 - 1;
      ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar32 + 0x10),uVar73);
      addChild(this,parent,ppEVar41);
    }
    break;
  case RefTestId:
    pRVar69 = Expression::cast<wasm::RefTest>(parent);
    addChild(this,parent,(Expression **)(pRVar69 + 0x10));
    break;
  case RefCastId:
    pRVar23 = Expression::cast<wasm::RefCast>(parent);
    addChild(this,parent,(Expression **)(pRVar23 + 0x10));
    break;
  case BrOnId:
    pBVar7 = Expression::cast<wasm::BrOn>(parent);
    addChild(this,parent,(Expression **)(pBVar7 + 0x28));
    break;
  case StructNewId:
    pSVar38 = Expression::cast<wasm::StructNew>(parent);
    uVar73 = (ulong)*(uint *)(pSVar38 + 0x18);
    while (0 < (int)uVar73) {
      uVar73 = uVar73 - 1;
      ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pSVar38 + 0x10),uVar73);
      addChild(this,parent,ppEVar41);
    }
    break;
  case StructGetId:
    pSVar13 = Expression::cast<wasm::StructGet>(parent);
    addChild(this,parent,(Expression **)(pSVar13 + 0x18));
    break;
  case StructSetId:
    pSVar29 = Expression::cast<wasm::StructSet>(parent);
    addChild(this,parent,(Expression **)(pSVar29 + 0x20));
    addChild(this,parent,(Expression **)(pSVar29 + 0x18));
    break;
  case ArrayNewId:
    pAVar39 = Expression::cast<wasm::ArrayNew>(parent);
    addChild(this,parent,(Expression **)(pAVar39 + 0x18));
    if (*(long *)(pAVar39 + 0x10) != 0) {
      addChild(this,parent,(Expression **)(pAVar39 + 0x10));
    }
    break;
  case ArrayNewSegId:
    pAVar42 = Expression::cast<wasm::ArrayNewSeg>(parent);
    addChild(this,parent,(Expression **)(pAVar42 + 0x30));
    addChild(this,parent,(Expression **)(pAVar42 + 0x28));
    break;
  case ArrayNewFixedId:
    pAVar40 = Expression::cast<wasm::ArrayNewFixed>(parent);
    uVar73 = (ulong)*(uint *)(pAVar40 + 0x18);
    while (0 < (int)uVar73) {
      uVar73 = uVar73 - 1;
      ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pAVar40 + 0x10),uVar73);
      addChild(this,parent,ppEVar41);
    }
    break;
  case ArrayGetId:
    pAVar54 = Expression::cast<wasm::ArrayGet>(parent);
    addChild(this,parent,(Expression **)(pAVar54 + 0x18));
    addChild(this,parent,(Expression **)(pAVar54 + 0x10));
    break;
  case ArraySetId:
    pAVar9 = Expression::cast<wasm::ArraySet>(parent);
    addChild(this,parent,(Expression **)(pAVar9 + 0x20));
    addChild(this,parent,(Expression **)(pAVar9 + 0x18));
    addChild(this,parent,(Expression **)(pAVar9 + 0x10));
    break;
  case ArrayLenId:
    pAVar36 = Expression::cast<wasm::ArrayLen>(parent);
    addChild(this,parent,(Expression **)(pAVar36 + 0x10));
    break;
  case ArrayCopyId:
    pAVar3 = Expression::cast<wasm::ArrayCopy>(parent);
    addChild(this,parent,(Expression **)(pAVar3 + 0x30));
    addChild(this,parent,(Expression **)(pAVar3 + 0x28));
    addChild(this,parent,(Expression **)(pAVar3 + 0x20));
    addChild(this,parent,(Expression **)(pAVar3 + 0x18));
    addChild(this,parent,(Expression **)(pAVar3 + 0x10));
    break;
  case ArrayFillId:
    pAVar33 = Expression::cast<wasm::ArrayFill>(parent);
    addChild(this,parent,(Expression **)(pAVar33 + 0x28));
    addChild(this,parent,(Expression **)(pAVar33 + 0x20));
    addChild(this,parent,(Expression **)(pAVar33 + 0x18));
    addChild(this,parent,(Expression **)(pAVar33 + 0x10));
    break;
  case ArrayInitId:
    pAVar5 = Expression::cast<wasm::ArrayInit>(parent);
    addChild(this,parent,(Expression **)(pAVar5 + 0x40));
    addChild(this,parent,(Expression **)(pAVar5 + 0x38));
    addChild(this,parent,(Expression **)(pAVar5 + 0x30));
    addChild(this,parent,(Expression **)(pAVar5 + 0x28));
    break;
  case RefAsId:
    pRVar30 = Expression::cast<wasm::RefAs>(parent);
    addChild(this,parent,&pRVar30->value);
    break;
  case StringNewId:
    pSVar72 = Expression::cast<wasm::StringNew>(parent);
    if (*(long *)(pSVar72 + 0x30) != 0) {
      addChild(this,parent,(Expression **)(pSVar72 + 0x30));
    }
    if (*(long *)(pSVar72 + 0x28) != 0) {
      addChild(this,parent,(Expression **)(pSVar72 + 0x28));
    }
    if (*(long *)(pSVar72 + 0x20) != 0) {
      addChild(this,parent,(Expression **)(pSVar72 + 0x20));
    }
    addChild(this,parent,(Expression **)(pSVar72 + 0x18));
    break;
  case StringConstId:
    Expression::cast<wasm::StringConst>(parent);
    return;
  case StringMeasureId:
    pSVar2 = Expression::cast<wasm::StringMeasure>(parent);
    addChild(this,parent,(Expression **)(pSVar2 + 0x18));
    break;
  case StringEncodeId:
    pSVar53 = Expression::cast<wasm::StringEncode>(parent);
    if (*(long *)(pSVar53 + 0x28) != 0) {
      addChild(this,parent,(Expression **)(pSVar53 + 0x28));
    }
    addChild(this,parent,(Expression **)(pSVar53 + 0x20));
    addChild(this,parent,(Expression **)(pSVar53 + 0x18));
    break;
  case StringConcatId:
    pSVar68 = Expression::cast<wasm::StringConcat>(parent);
    addChild(this,parent,(Expression **)(pSVar68 + 0x18));
    addChild(this,parent,(Expression **)(pSVar68 + 0x10));
    break;
  case StringEqId:
    pSVar26 = Expression::cast<wasm::StringEq>(parent);
    addChild(this,parent,(Expression **)(pSVar26 + 0x20));
    addChild(this,parent,(Expression **)(pSVar26 + 0x18));
    break;
  case StringAsId:
    pSVar4 = Expression::cast<wasm::StringAs>(parent);
    addChild(this,parent,(Expression **)(pSVar4 + 0x18));
    break;
  case StringWTF8AdvanceId:
    pSVar22 = Expression::cast<wasm::StringWTF8Advance>(parent);
    addChild(this,parent,(Expression **)(pSVar22 + 0x20));
    addChild(this,parent,(Expression **)(pSVar22 + 0x18));
    addChild(this,parent,(Expression **)(pSVar22 + 0x10));
    break;
  case StringWTF16GetId:
    pSVar63 = Expression::cast<wasm::StringWTF16Get>(parent);
    addChild(this,parent,(Expression **)(pSVar63 + 0x18));
    addChild(this,parent,(Expression **)(pSVar63 + 0x10));
    break;
  case StringIterNextId:
    pSVar70 = Expression::cast<wasm::StringIterNext>(parent);
    addChild(this,parent,(Expression **)(pSVar70 + 0x10));
    break;
  case StringIterMoveId:
    pSVar71 = Expression::cast<wasm::StringIterMove>(parent);
    addChild(this,parent,(Expression **)(pSVar71 + 0x20));
    addChild(this,parent,(Expression **)(pSVar71 + 0x18));
    break;
  case StringSliceWTFId:
    pSVar21 = Expression::cast<wasm::StringSliceWTF>(parent);
    addChild(this,parent,(Expression **)(pSVar21 + 0x28));
    addChild(this,parent,(Expression **)(pSVar21 + 0x20));
    addChild(this,parent,(Expression **)(pSVar21 + 0x18));
    break;
  case StringSliceIterId:
    pSVar20 = Expression::cast<wasm::StringSliceIter>(parent);
    addChild(this,parent,(Expression **)(pSVar20 + 0x18));
    addChild(this,parent,(Expression **)(pSVar20 + 0x10));
  }
  return;
}

Assistant:

AbstractChildIterator(Expression* parent) {
    auto* self = (Specific*)this;

#define DELEGATE_ID parent->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = parent->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field) self->addChild(parent, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  if (cast->field) {                                                           \
    self->addChild(parent, &cast->field);                                      \
  }

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }